

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGB4444ToUVRow_C(uint8_t *src_argb4444,int src_stride_argb4444,uint8_t *dst_u,uint8_t *dst_v,
                      int width)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  ushort uVar10;
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  unkuint9 Var13;
  undefined1 auVar14 [11];
  undefined1 auVar15 [13];
  undefined1 auVar16 [15];
  unkuint9 Var17;
  undefined1 auVar18 [11];
  undefined1 auVar19 [13];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [13];
  undefined3 uVar26;
  undefined3 uVar27;
  undefined3 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined8 uVar32;
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined5 uVar35;
  undefined5 uVar36;
  undefined5 uVar37;
  undefined1 auVar38 [12];
  undefined8 uVar39;
  undefined1 auVar40 [12];
  undefined8 uVar41;
  undefined1 auVar42 [12];
  undefined1 auVar43 [14];
  undefined8 uVar44;
  undefined1 auVar45 [14];
  undefined8 uVar46;
  undefined1 auVar47 [14];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint uVar53;
  int iVar54;
  uint uVar55;
  uint uVar56;
  long lVar57;
  undefined1 auVar58 [16];
  byte bVar59;
  undefined1 uVar60;
  undefined1 uVar61;
  undefined1 uVar62;
  undefined1 uVar63;
  undefined1 uVar64;
  undefined1 uVar65;
  byte bVar66;
  undefined1 uVar68;
  ushort uVar67;
  undefined1 uVar69;
  undefined1 uVar71;
  ushort uVar70;
  undefined1 uVar72;
  undefined1 uVar74;
  undefined2 uVar73;
  undefined1 uVar75;
  undefined1 uVar76;
  undefined1 uVar77;
  byte bVar78;
  undefined1 uVar79;
  undefined1 uVar80;
  undefined1 uVar81;
  undefined1 uVar82;
  undefined1 uVar83;
  undefined1 uVar84;
  undefined1 uVar85;
  undefined1 uVar86;
  undefined1 uVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  
  auVar52 = _DAT_004d2a60;
  auVar51 = _DAT_004d2a50;
  auVar50 = _DAT_004d2a40;
  auVar49 = _DAT_004d2a30;
  auVar48 = _DAT_004d2980;
  lVar57 = (long)src_stride_argb4444;
  if (1 < width) {
    iVar54 = 0;
    auVar58 = ZEXT416(0x70ffee);
    do {
      auVar88 = ZEXT216(*(ushort *)src_argb4444);
      auVar89 = ZEXT216(*(ushort *)((long)src_argb4444 + 2));
      uVar67 = *(ushort *)((long)src_argb4444 + lVar57);
      uVar70 = *(ushort *)((long)src_argb4444 + lVar57 + 2);
      auVar90 = psllw(auVar88,4);
      auVar91 = auVar90 & auVar50 | auVar88 & auVar49;
      auVar90 = psllw(auVar89,4);
      auVar92 = auVar90 & auVar50 | auVar89 & auVar49;
      auVar90 = psllw(ZEXT216(uVar67),4);
      auVar90 = auVar90 & auVar50 | ZEXT216(uVar67) & auVar49;
      bVar78 = pavgb(auVar90[0],auVar91[0]);
      uVar79 = pavgb(auVar90[1],auVar91[1]);
      uVar80 = pavgb(auVar90[2],auVar91[2]);
      uVar81 = pavgb(auVar90[3],auVar91[3]);
      uVar82 = pavgb(auVar90[4],auVar91[4]);
      uVar83 = pavgb(auVar90[5],auVar91[5]);
      uVar84 = pavgb(auVar90[6],auVar91[6]);
      uVar85 = pavgb(auVar90[7],auVar91[7]);
      uVar86 = pavgb(auVar90[8],auVar91[8]);
      uVar87 = pavgb(auVar90[9],auVar91[9]);
      uVar26 = CONCAT12(uVar87,CONCAT11(uVar86,uVar85));
      uVar87 = pavgb(auVar90[10],auVar91[10]);
      uVar56 = CONCAT13(uVar87,uVar26);
      uVar87 = pavgb(auVar90[0xb],auVar91[0xb]);
      uVar35 = CONCAT14(uVar87,uVar56);
      uVar87 = pavgb(auVar90[0xc],auVar91[0xc]);
      auVar43[5] = uVar87;
      auVar43._0_5_ = uVar35;
      pavgb(auVar90[0xd],auVar91[0xd]);
      pavgb(auVar90[0xe],auVar91[0xe]);
      pavgb(auVar90[0xf],auVar91[0xf]);
      uVar10 = (ushort)(CONCAT13((char)(uVar70 >> 8),CONCAT12((char)(uVar67 >> 8),uVar67)) >> 0x10);
      uVar67 = CONCAT11((char)uVar70,(char)uVar67);
      auVar90 = psllw(ZEXT216(uVar70),4);
      auVar90 = auVar90 & auVar50 | ZEXT216(uVar70) & auVar49;
      bVar66 = pavgb(auVar90[0],auVar92[0]);
      uVar68 = pavgb(auVar90[1],auVar92[1]);
      uVar69 = pavgb(auVar90[2],auVar92[2]);
      uVar71 = pavgb(auVar90[3],auVar92[3]);
      uVar72 = pavgb(auVar90[4],auVar92[4]);
      uVar74 = pavgb(auVar90[5],auVar92[5]);
      uVar75 = pavgb(auVar90[6],auVar92[6]);
      uVar76 = pavgb(auVar90[7],auVar92[7]);
      uVar77 = pavgb(auVar90[8],auVar92[8]);
      uVar87 = pavgb(auVar90[9],auVar92[9]);
      uVar27 = CONCAT12(uVar87,CONCAT11(uVar77,uVar76));
      uVar87 = pavgb(auVar90[10],auVar92[10]);
      uVar53 = CONCAT13(uVar87,uVar27);
      uVar87 = pavgb(auVar90[0xb],auVar92[0xb]);
      uVar36 = CONCAT14(uVar87,uVar53);
      uVar87 = pavgb(auVar90[0xc],auVar92[0xc]);
      auVar45[5] = uVar87;
      auVar45._0_5_ = uVar36;
      pavgb(auVar90[0xd],auVar92[0xd]);
      pavgb(auVar90[0xe],auVar92[0xe]);
      pavgb(auVar90[0xf],auVar92[0xf]);
      auVar90 = psllw(auVar89,8);
      auVar90 = ~auVar51 & auVar90 | auVar88 & auVar51;
      auVar88._0_2_ = auVar90._0_2_ >> 4;
      auVar88._2_2_ = auVar90._2_2_ >> 4;
      auVar88._4_2_ = auVar90._4_2_ >> 4;
      auVar88._6_2_ = auVar90._6_2_ >> 4;
      auVar88._8_2_ = auVar90._8_2_ >> 4;
      auVar88._10_2_ = auVar90._10_2_ >> 4;
      auVar88._12_2_ = auVar90._12_2_ >> 4;
      auVar88._14_2_ = auVar90._14_2_ >> 4;
      auVar88 = auVar90 & auVar52 | auVar88 & auVar48;
      auVar90 = ZEXT416(CONCAT22(uVar10,uVar67)) & auVar52 |
                ZEXT416(CONCAT22(uVar10 >> 4,uVar67 >> 4)) & auVar48;
      bVar59 = pavgb(auVar90[0],auVar88[0]);
      uVar87 = pavgb(auVar90[1],auVar88[1]);
      pavgb(auVar90[2],auVar88[2]);
      pavgb(auVar90[3],auVar88[3]);
      uVar60 = pavgb(0,auVar88[4]);
      uVar61 = pavgb(0,auVar88[5]);
      uVar62 = pavgb(0,auVar88[6]);
      uVar63 = pavgb(0,auVar88[7]);
      uVar64 = pavgb(auVar90[8],auVar88[8]);
      uVar65 = pavgb(auVar90[9],auVar88[9]);
      uVar28 = CONCAT12(uVar65,CONCAT11(uVar64,uVar63));
      uVar65 = pavgb(auVar90[10],auVar88[10]);
      uVar55 = CONCAT13(uVar65,uVar28);
      uVar65 = pavgb(auVar90[0xb],auVar88[0xb]);
      uVar37 = CONCAT14(uVar65,uVar55);
      uVar65 = pavgb(auVar90[0xc],auVar88[0xc]);
      auVar47[5] = uVar65;
      auVar47._0_5_ = uVar37;
      pavgb(auVar90[0xd],auVar88[0xd]);
      pavgb(auVar90[0xe],auVar88[0xe]);
      pavgb(auVar90[0xf],auVar88[0xf]);
      auVar43._6_8_ = 0;
      auVar1[0xe] = uVar85;
      auVar1._0_14_ = auVar43 << 0x38;
      uVar44 = CONCAT26(auVar1._13_2_,CONCAT15(uVar84,uVar35));
      auVar38._4_8_ = 0;
      auVar38._0_4_ = uVar56;
      auVar4._12_3_ = (int3)((ulong)uVar44 >> 0x28);
      auVar4._0_12_ = auVar38 << 0x38;
      uVar39 = CONCAT44(auVar4._11_4_,CONCAT13(uVar83,uVar26));
      auVar7._10_5_ = (int5)((ulong)uVar39 >> 0x18);
      auVar7._0_10_ = (unkuint10)CONCAT11(uVar86,uVar85) << 0x38;
      uVar29 = CONCAT62(auVar7._9_6_,CONCAT11(uVar82,uVar85));
      auVar12._7_8_ = 0;
      auVar12._0_7_ = (uint7)((ulong)uVar29 >> 8);
      Var13 = CONCAT81(SUB158(auVar12 << 0x40,7),uVar81);
      auVar30._9_6_ = 0;
      auVar30._0_9_ = Var13;
      auVar14._1_10_ = SUB1510(auVar30 << 0x30,5);
      auVar14[0] = uVar80;
      auVar31._11_4_ = 0;
      auVar31._0_11_ = auVar14;
      auVar15._1_12_ = SUB1512(auVar31 << 0x20,3);
      auVar15[0] = uVar79;
      auVar45._6_8_ = 0;
      auVar2[0xe] = uVar76;
      auVar2._0_14_ = auVar45 << 0x38;
      uVar46 = CONCAT26(auVar2._13_2_,CONCAT15(uVar75,uVar36));
      auVar40._4_8_ = 0;
      auVar40._0_4_ = uVar53;
      auVar5._12_3_ = (int3)((ulong)uVar46 >> 0x28);
      auVar5._0_12_ = auVar40 << 0x38;
      uVar41 = CONCAT44(auVar5._11_4_,CONCAT13(uVar74,uVar27));
      auVar8._10_5_ = (int5)((ulong)uVar41 >> 0x18);
      auVar8._0_10_ = (unkuint10)CONCAT11(uVar77,uVar76) << 0x38;
      uVar32 = CONCAT62(auVar8._9_6_,CONCAT11(uVar72,uVar76));
      auVar16._7_8_ = 0;
      auVar16._0_7_ = (uint7)((ulong)uVar32 >> 8);
      Var17 = CONCAT81(SUB158(auVar16 << 0x40,7),uVar71);
      auVar33._9_6_ = 0;
      auVar33._0_9_ = Var17;
      auVar18._1_10_ = SUB1510(auVar33 << 0x30,5);
      auVar18[0] = uVar69;
      auVar34._11_4_ = 0;
      auVar34._0_11_ = auVar18;
      auVar19._1_12_ = SUB1512(auVar34 << 0x20,3);
      auVar19[0] = uVar68;
      uVar67 = pavgw((ushort)bVar66,(ushort)bVar78);
      uVar70 = pavgw(auVar19._0_2_,auVar15._0_2_);
      auVar90._2_2_ = uVar70;
      auVar90._0_2_ = uVar67;
      uVar73 = pavgw(auVar18._0_2_,auVar14._0_2_);
      auVar90._4_2_ = uVar73;
      uVar73 = pavgw((short)Var17,(short)Var13);
      auVar90._6_2_ = uVar73;
      uVar73 = pavgw((short)((ulong)uVar32 >> 8),(short)((ulong)uVar29 >> 8));
      auVar90._8_2_ = uVar73;
      uVar73 = pavgw((short)((ulong)uVar41 >> 0x18),(short)((ulong)uVar39 >> 0x18));
      auVar90._10_2_ = uVar73;
      uVar73 = pavgw((short)((ulong)uVar46 >> 0x28),(short)((ulong)uVar44 >> 0x28));
      auVar90._12_2_ = uVar73;
      pavgw(auVar2._13_2_ >> 8,auVar1._13_2_ >> 8);
      auVar47._6_8_ = 0;
      auVar3[0xe] = uVar63;
      auVar3._0_14_ = auVar47 << 0x38;
      auVar42._4_8_ = 0;
      auVar42._0_4_ = uVar55;
      auVar6._12_3_ = (int3)(CONCAT26(auVar3._13_2_,CONCAT15(uVar62,uVar37)) >> 0x28);
      auVar6._0_12_ = auVar42 << 0x38;
      auVar9._10_5_ = (int5)(CONCAT44(auVar6._11_4_,CONCAT13(uVar61,uVar28)) >> 0x18);
      auVar9._0_10_ = (unkuint10)CONCAT11(uVar64,uVar63) << 0x38;
      auVar20._7_8_ = 0;
      auVar20._0_7_ = (uint7)(CONCAT62(auVar9._9_6_,CONCAT11(uVar60,uVar63)) >> 8);
      auVar21._8_7_ = 0;
      auVar21._0_8_ = SUB158(auVar20 << 0x40,7);
      auVar22._9_6_ = 0;
      auVar22._0_9_ = SUB159(auVar21 << 0x38,6);
      auVar23._10_5_ = 0;
      auVar23._0_10_ = SUB1510(auVar22 << 0x30,5);
      auVar24._11_4_ = 0;
      auVar24._0_11_ = SUB1511(auVar23 << 0x28,4);
      auVar25._1_12_ = SUB1512(auVar24 << 0x20,3);
      auVar25[0] = uVar87;
      auVar11[1] = 0;
      auVar11[0] = bVar59;
      auVar11._2_13_ = auVar25;
      auVar90._14_2_ = 0;
      auVar90 = auVar90 & ZEXT416(0xff00ff);
      pmulhuw(auVar90,auVar58);
      uVar56 = ((uint)auVar25._0_2_ + auVar11._0_4_ + 1 & 0xffff) >> 1;
      *dst_u = (uint8_t)(((uint)uVar70 * 0xffda ^ 0x8000) + (uint)uVar67 * 0x70 + uVar56 * 0xffb6 >>
                        8);
      *dst_v = (uint8_t)((uVar56 * 0xffa2 ^ 0x8000) + (uint)(ushort)(auVar90._0_2_ * auVar58._0_2_)
                         + (uint)(ushort)(auVar90._2_2_ * auVar58._2_2_) >> 8);
      src_argb4444 = (uint8_t *)((long)src_argb4444 + 4);
      dst_u = dst_u + 1;
      dst_v = dst_v + 1;
      iVar54 = iVar54 + 2;
    } while (iVar54 < width + -1);
  }
  if ((width & 1U) != 0) {
    bVar59 = (byte)*(ushort *)src_argb4444;
    bVar66 = *(byte *)(lVar57 + (long)src_argb4444);
    bVar78 = ((byte *)(lVar57 + (long)src_argb4444))[1];
    uVar55 = (uint)(byte)(bVar66 << 4 | bVar66 & 0xf) + (uint)(byte)(bVar59 << 4 | bVar59 & 0xf) + 1
             >> 1 & 0xff;
    uVar53 = (uint)(byte)(bVar66 & 0xf0 | bVar66 >> 4) + (uint)(byte)(bVar59 & 0xf0 | bVar59 >> 4) +
             1 >> 1 & 0xff;
    uVar56 = (uint)(byte)(bVar78 << 4 | bVar78 & 0xf) +
             (uint)(byte)(*(byte *)((long)src_argb4444 + 1) << 4 |
                         *(byte *)((long)src_argb4444 + 1) & 0xf) + 1 >> 1 & 0xff;
    *dst_u = (uint8_t)((uVar56 * 0xffda ^ 0x8000) + uVar53 * 0xffb6 + uVar55 * 0x70 >> 8);
    *dst_v = (uint8_t)((uVar53 * 0xffa2 ^ 0x8000) + uVar55 * 0xffee + uVar56 * 0x70 >> 8);
  }
  return;
}

Assistant:

void ARGB4444ToUVRow_C(const uint8_t* src_argb4444,
                       int src_stride_argb4444,
                       uint8_t* dst_u,
                       uint8_t* dst_v,
                       int width) {
  const uint8_t* next_argb4444 = src_argb4444 + src_stride_argb4444;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint8_t b0 = src_argb4444[0] & 0x0f;
    uint8_t g0 = src_argb4444[0] >> 4;
    uint8_t r0 = src_argb4444[1] & 0x0f;
    uint8_t b1 = src_argb4444[2] & 0x0f;
    uint8_t g1 = src_argb4444[2] >> 4;
    uint8_t r1 = src_argb4444[3] & 0x0f;
    uint8_t b2 = next_argb4444[0] & 0x0f;
    uint8_t g2 = next_argb4444[0] >> 4;
    uint8_t r2 = next_argb4444[1] & 0x0f;
    uint8_t b3 = next_argb4444[2] & 0x0f;
    uint8_t g3 = next_argb4444[2] >> 4;
    uint8_t r3 = next_argb4444[3] & 0x0f;

    b0 = (b0 << 4) | b0;
    g0 = (g0 << 4) | g0;
    r0 = (r0 << 4) | r0;
    b1 = (b1 << 4) | b1;
    g1 = (g1 << 4) | g1;
    r1 = (r1 << 4) | r1;
    b2 = (b2 << 4) | b2;
    g2 = (g2 << 4) | g2;
    r2 = (r2 << 4) | r2;
    b3 = (b3 << 4) | b3;
    g3 = (g3 << 4) | g3;
    r3 = (r3 << 4) | r3;

#if defined(LIBYUV_ARGBTOUV_PAVGB)
    uint8_t ab = AVGB(AVGB(b0, b2), AVGB(b1, b3));
    uint8_t ag = AVGB(AVGB(g0, g2), AVGB(g1, g3));
    uint8_t ar = AVGB(AVGB(r0, r2), AVGB(r1, r3));
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
#else
    uint16_t b = (b0 + b1 + b2 + b3 + 1) >> 1;
    uint16_t g = (g0 + g1 + g2 + g3 + 1) >> 1;
    uint16_t r = (r0 + r1 + r2 + r3 + 1) >> 1;
    dst_u[0] = RGB2xToU(r, g, b);
    dst_v[0] = RGB2xToV(r, g, b);
#endif

    src_argb4444 += 4;
    next_argb4444 += 4;
    dst_u += 1;
    dst_v += 1;
  }
  if (width & 1) {
    uint8_t b0 = src_argb4444[0] & 0x0f;
    uint8_t g0 = src_argb4444[0] >> 4;
    uint8_t r0 = src_argb4444[1] & 0x0f;
    uint8_t b2 = next_argb4444[0] & 0x0f;
    uint8_t g2 = next_argb4444[0] >> 4;
    uint8_t r2 = next_argb4444[1] & 0x0f;

    b0 = (b0 << 4) | b0;
    g0 = (g0 << 4) | g0;
    r0 = (r0 << 4) | r0;
    b2 = (b2 << 4) | b2;
    g2 = (g2 << 4) | g2;
    r2 = (r2 << 4) | r2;

#if defined(LIBYUV_ARGBTOUV_PAVGB)
    uint8_t ab = AVGB(b0, b2);
    uint8_t ag = AVGB(g0, g2);
    uint8_t ar = AVGB(r0, r2);
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
#else
    uint16_t b = b0 + b2;
    uint16_t g = g0 + g2;
    uint16_t r = r0 + r2;
    dst_u[0] = RGB2xToU(r, g, b);
    dst_v[0] = RGB2xToV(r, g, b);
#endif
  }
}